

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gnutar_filename_encoding.c
# Opt level: O0

void test_gnutar_filename_encoding_KOI8R_UTF8(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *a_00;
  size_t local_1020;
  size_t used;
  char buff [4096];
  archive_entry *entry;
  archive *a;
  
  pcVar2 = setlocale(6,"ru_RU.KOI8-R");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                   ,L'M');
    test_skipping("KOI8-R locale not available on this system.");
  }
  else {
    a_00 = (archive_conflict *)archive_write_new();
    iVar1 = archive_write_set_format_gnutar((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                        ,L'V',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_gnutar(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options((archive *)a_00,"hdrcharset=UTF-8");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory((archive *)a_00,&used,0x1000,&local_1020);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                          ,L'^',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      buff._4088_8_ = archive_entry_new2(a_00);
      archive_entry_set_pathname((archive_entry *)buff._4088_8_,anon_var_dwarf_17334);
      archive_entry_set_filetype((archive_entry *)buff._4088_8_,0x8000);
      archive_entry_set_size((archive_entry *)buff._4088_8_,0);
      iVar1 = archive_write_header((archive *)a_00,(archive_entry *)buff._4088_8_);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                          ,L'e',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free((archive_entry *)buff._4088_8_);
      iVar1 = archive_write_free((archive *)a_00);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                          ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                          ,L'k',&used,"buff",anon_var_dwarf_1724e,
                          "\"\\xD0\\xBF\\xD1\\x80\\xD0\\xB8\"",6,"6",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                     ,L'X');
      test_skipping("This system cannot convert character-set from KOI8-R to UTF-8.");
      archive_write_free((archive *)a_00);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_gnutar_filename_encoding_KOI8R_UTF8)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "ru_RU.KOI8-R")) {
		skipping("KOI8-R locale not available on this system.");
		return;
	}

	/*
	 * Verify that KOI8-R filenames are correctly translated into UTF-8
	 * and stored with hdrcharset=UTF-8 option.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_gnutar(a));
	if (archive_write_set_options(a, "hdrcharset=UTF-8") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from KOI8-R to UTF-8.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set a KOI8-R filename. */
	archive_entry_set_pathname(entry, "\xD0\xD2\xC9");
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Above three characters in KOI8-R should translate to the following
	 * three characters (two bytes each) in UTF-8. */
	assertEqualMem(buff, "\xD0\xBF\xD1\x80\xD0\xB8", 6);
}